

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  vector<const_char_*,_std::allocator<const_char_*>_> views_00;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  invalid_argument *this;
  value_type *__x;
  vector<const_char_*,_std::allocator<const_char_*>_> *__x_00;
  size_t i;
  ulong uVar6;
  long lVar7;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> *this_00;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> *this_01;
  bool bVar8;
  bool override;
  undefined8 uStack_108;
  vector<const_char_*,_std::allocator<const_char_*>_> inFiles;
  char *local_d8;
  char *view;
  vector<const_char_*,_std::allocator<const_char_*>_> views;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_a8;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_90;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_78;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_60;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_48;
  
  inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  views.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  view = (char *)0x0;
  views.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  views.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = argv + 1;
  override = false;
  iVar3 = 0;
  local_d8 = (char *)0x0;
  for (lVar7 = 1; lVar7 < argc; lVar7 = lVar7 + 1) {
    pcVar4 = *__x;
    cVar1 = *pcVar4;
    if ((((cVar1 == '-') && (pcVar4[1] == 'h')) && (pcVar4[2] == '\0')) ||
       (iVar2 = strcmp(pcVar4,"--help"), iVar2 == 0)) {
      usageMessage((ostream *)&std::cout,"exrmultipart",true);
      goto LAB_00107bf3;
    }
    iVar2 = strcmp(pcVar4,"--version");
    if (iVar2 == 0) {
      pcVar4 = (char *)Imf_3_2::getLibraryVersion();
      poVar5 = std::operator<<((ostream *)&std::cout,"exrmultipart (OpenEXR) ");
      std::operator<<(poVar5,"3.2.0");
      iVar3 = strcmp(pcVar4,"3.2.0");
      if (iVar3 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::operator<<(poVar5,")");
      }
      poVar5 = std::operator<<((ostream *)&std::cout," https://openexr.com");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "Copyright (c) Contributors to the OpenEXR Project");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_00107bf3;
    }
    if (cVar1 == '-') {
      if ((pcVar4[1] == 'i') && (pcVar4[2] == '\0')) {
LAB_0010786a:
        iVar3 = 1;
      }
      else {
        if ((pcVar4[1] != 'o') || (pcVar4[2] != '\0')) goto LAB_001077d7;
        iVar3 = 2;
      }
    }
    else {
LAB_001077d7:
      iVar2 = strcmp(pcVar4,"-override");
      if (iVar2 == 0) {
LAB_00107861:
        iVar3 = 3;
      }
      else {
        iVar2 = strcmp(pcVar4,"-view");
        if (iVar2 == 0) {
          bVar8 = iVar3 != 1;
          iVar3 = 4;
          if (bVar8) {
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this,"-view requires -i");
            goto LAB_00107c37;
          }
        }
        else {
          switch(iVar3) {
          case 1:
            std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&inFiles,__x);
            std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&views,&view);
            iVar3 = 1;
            break;
          case 2:
            local_d8 = pcVar4;
            break;
          case 3:
            iVar3 = atoi(pcVar4);
            override = iVar3 != 0;
            goto LAB_00107861;
          case 4:
            view = pcVar4;
            goto LAB_0010786a;
          }
        }
      }
    }
    __x = __x + 1;
  }
  if (inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    usageMessage((ostream *)&std::cerr,*argv,false);
    iVar3 = 1;
    goto LAB_00107bf5;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"input:");
  std::endl<char,std::char_traits<char>>(poVar5);
  for (uVar6 = 0;
      uVar6 < (ulong)((long)inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"      ");
    std::operator<<(poVar5,inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar6]);
    if (views.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] != (char *)0x0) {
      poVar5 = std::operator<<((ostream *)&std::cout," in view ");
      std::operator<<(poVar5,views.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar6]);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  if (local_d8 == (char *)0x0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"No output file specified");
LAB_00107c37:
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"output:\n      ");
  poVar5 = std::operator<<(poVar5,local_d8);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"override:");
  poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  poVar5 = std::operator<<(poVar5,"\n");
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar4 = argv[1];
  iVar3 = strcmp(pcVar4,"-combine");
  if (iVar3 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"-combine multipart input ");
    std::endl<char,std::char_traits<char>>(poVar5);
    this_00 = &local_48;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00,&inFiles);
    this_01 = &local_60;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_01,&views);
    combine((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00,
            (vector<const_char_*,_std::allocator<const_char_*>_> *)this_01,local_d8,override);
LAB_00107be3:
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(this_01);
  }
  else {
    iVar3 = strcmp(pcVar4,"-separate");
    if (iVar3 != 0) {
      iVar3 = strcmp(pcVar4,"-convert");
      if (iVar3 != 0) {
        iVar3 = 0;
        usageMessage((ostream *)&std::cerr,*argv,false);
        goto LAB_00107bf5;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"-convert input to EXR2 multipart");
      std::endl<char,std::char_traits<char>>(poVar5);
      this_00 = &local_90;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00,&inFiles);
      this_01 = &local_a8;
      __x_00 = &views;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_01,__x_00);
      views_00.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = argv;
      views_00.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)uStack_108;
      views_00.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      convert((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00,views_00,(char *)__x_00
              ,SUB81(local_d8,0));
      goto LAB_00107be3;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"-separate multipart input ");
    std::endl<char,std::char_traits<char>>(poVar5);
    this_00 = &local_78;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00,&inFiles);
    separate((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00,local_d8,override);
  }
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(this_00);
LAB_00107bf3:
  iVar3 = 0;
LAB_00107bf5:
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&views.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return iVar3;
}

Assistant:

int
main (int argc, char* argv[])
{
    try {
        
        vector<const char*> inFiles;
        vector<const char*> views;
        const char*         view     = 0;
        const char*         outFile  = 0;
        bool                override = false;

        int i = 1;
        int mode = 0; // 0-do not read input, 1-infiles, 2-outfile, 3-override, 4-view

        while (i < argc)
        {
            if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))     
            {
                usageMessage (cout, "exrmultipart", true);
                return 0;
            }

            if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion();
            
                cout << "exrmultipart (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp(libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }

            if (!strcmp (argv[i], "-i"))
            {
                mode = 1;
            }
            else if (!strcmp (argv[i], "-o"))
            {
                mode = 2;
            }
            else if (!strcmp (argv[i], "-override"))
            {
                mode = 3;
            }
            else if (!strcmp (argv[i], "-view"))
            {
                if (mode != 1)
                    throw invalid_argument("-view requires -i");

                mode = 4;
            }
            else
            {
                switch (mode)
                {
                  case 1:
                      inFiles.push_back (argv[i]);
                      views.push_back (view);
                      break;
                  case 2: outFile = argv[i]; break;
                  case 3: override = atoi (argv[i]); break;
                  case 4:
                      view = argv[i];
                      mode = 1;
                      break;
                }
            }
            i++;
        }

        // check input and output files found or not
        if (inFiles.size () == 0)
        {
            usageMessage(cerr, argv[0], false);
            return 1;
        }

        cout << "input:" << endl;
        for (size_t i = 0; i < inFiles.size (); i++)
        {
            cout << "      " << inFiles[i];
            if (views[i])
                cout << " in view " << views[i];
            cout << endl;
        }

        if (!outFile)
            throw invalid_argument("No output file specified");

        cout << "output:\n      " << outFile << endl;
        cout << "override:" << override << "\n" << endl;

        if (!strcmp (argv[1], "-combine"))
        {
            cout << "-combine multipart input " << endl;
            combine (inFiles, views, outFile, override);
        }
        else if (!strcmp (argv[1], "-separate"))
        {
            cout << "-separate multipart input " << endl;
            separate (inFiles, outFile, override);
        }
        else if (!strcmp (argv[1], "-convert"))
        {
            cout << "-convert input to EXR2 multipart" << endl;
            convert (inFiles, views, outFile, override);
        }
        else
        {
            usageMessage (cerr, argv[0], false);
        }
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }
    
    return 0;
}